

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7decomp.cpp
# Opt level: O0

bool bc7decomp::unpack_bc7(void *pBlock,color_rgba *pPixels)

{
  bool bVar1;
  byte *in_RDI;
  uint32_t mode;
  uint32_t first_byte;
  color_rgba *in_stack_00000070;
  void *in_stack_00000078;
  color_rgba *in_stack_00000150;
  void *in_stack_00000158;
  uint32_t in_stack_00000160;
  color_rgba *in_stack_00000170;
  void *in_stack_00000178;
  uint32_t in_stack_00000180;
  undefined4 in_stack_00000184;
  void *in_stack_00000188;
  uint32_t in_stack_00000190;
  uint local_20;
  
  for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
    if (((uint)*in_RDI & 1 << ((byte)local_20 & 0x1f)) != 0) {
      switch(local_20) {
      case 0:
      case 2:
        bVar1 = unpack_bc7_mode0_2(in_stack_00000180,in_stack_00000178,in_stack_00000170);
        return bVar1;
      case 1:
      case 3:
      case 7:
        bVar1 = unpack_bc7_mode1_3_7(in_stack_00000160,in_stack_00000158,in_stack_00000150);
        return bVar1;
      case 4:
      case 5:
        bVar1 = unpack_bc7_mode4_5(in_stack_00000190,in_stack_00000188,
                                   (color_rgba *)CONCAT44(in_stack_00000184,in_stack_00000180));
        return bVar1;
      case 6:
        bVar1 = unpack_bc7_mode6(in_stack_00000078,in_stack_00000070);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool unpack_bc7(const void *pBlock, color_rgba *pPixels)
{
	const uint32_t first_byte = static_cast<const uint8_t*>(pBlock)[0];

	for (uint32_t mode = 0; mode <= 7; mode++)
	{
		if (first_byte & (1U << mode))
		{
			switch (mode)
			{
			case 0:
			case 2:
				return unpack_bc7_mode0_2(mode, pBlock, pPixels);
			case 1:
			case 3:
			case 7:
				return unpack_bc7_mode1_3_7(mode, pBlock, pPixels);
			case 4:
			case 5:
				return unpack_bc7_mode4_5(mode, pBlock, pPixels);
			case 6:
				return unpack_bc7_mode6(pBlock, pPixels);
			default:
				break;
			}
		}
	}

	return false;
}